

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

int __thiscall SQLite::Statement::tryExecuteStep(Statement *this)

{
  int iVar1;
  
  iVar1 = 0x15;
  if (this->mbDone == false) {
    iVar1 = sqlite3_step((this->mpPreparedStatement).
                         super___shared_ptr<sqlite3_stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (iVar1 == 100) {
      this->mbHasRow = true;
      iVar1 = 100;
    }
    else {
      this->mbHasRow = false;
      this->mbDone = iVar1 == 0x65;
    }
  }
  return iVar1;
}

Assistant:

int Statement::tryExecuteStep() noexcept
{
    if (mbDone)
    {
        return SQLITE_MISUSE; // Statement needs to be reseted !
    }

    const int ret = sqlite3_step(mpPreparedStatement.get());
    if (SQLITE_ROW == ret) // one row is ready : call getColumn(N) to access it
    {
        mbHasRow = true;
    }
    else
    {
        mbHasRow = false;
        mbDone = SQLITE_DONE == ret; // check if the query has finished executing
    }
    return ret;
}